

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MolecularRestraint.hpp
# Opt level: O0

void __thiscall OpenMD::MolecularRestraint::~MolecularRestraint(MolecularRestraint *this)

{
  MolecularRestraint *in_RDI;
  
  ~MolecularRestraint(in_RDI);
  operator_delete(in_RDI,0x100);
  return;
}

Assistant:

MolecularRestraint() : Restraint() {}